

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<int[2][3][5]>
          (Object_Data *this,reference_wrapper<int[2][3][5]> obj,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  undefined1 local_49;
  Any local_48;
  Any local_40 [3];
  int (*local_28) [2] [3] [5];
  int (*p) [2] [3] [5];
  reference_wrapper<int[2][3][5]> rStack_18;
  bool t_return_value_local;
  reference_wrapper<int[2][3][5]> obj_local;
  
  p._7_1_ = t_return_value;
  rStack_18._M_data = obj._M_data;
  obj_local._M_data = (int (*) [2] [3] [5])this;
  local_28 = std::reference_wrapper<int[2][3][5]>::get(&stack0xffffffffffffffe8);
  detail::Get_Type_Info<int[2][3][5]>::get();
  detail::Any::Any<std::reference_wrapper<int[2][3][5]>,void>(&local_48,&stack0xffffffffffffffe8);
  local_49 = 1;
  std::
  make_shared<chaiscript::Boxed_Value::Data,_chaiscript::Type_Info,_chaiscript::detail::Any,_bool,_int_(*&)[2][3][5],_bool_&>
            ((Type_Info *)this,local_40,(bool *)&local_48,(int (**) [2] [3] [5])&local_49,
             (bool *)&local_28);
  detail::Any::~Any(&local_48);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(std::reference_wrapper<T> obj, bool t_return_value) {
        auto p = &obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(obj)), true, p, t_return_value);
      }